

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_etc.c
# Opt level: O0

void zzAddAndW(word *b,word *a,size_t n,word w)

{
  ulong uVar1;
  size_t i;
  word prod;
  word carry;
  word w_local;
  size_t n_local;
  word *a_local;
  word *b_local;
  
  carry = 0;
  for (i = 0; i < n; i = i + 1) {
    uVar1 = carry + (w & a[i]);
    b[i] = uVar1 + b[i];
    carry = (word)(int)(uint)(b[i] < uVar1 || uVar1 < carry);
  }
  return;
}

Assistant:

void zzAddAndW(word b[], const word a[], size_t n, register word w)
{
	register word carry = 0;
	register word prod;
	size_t i;
	ASSERT(wwIsSameOrDisjoint(a, b, n));
	for (i = 0; i < n; ++i)
	{
		prod = w & a[i];
		prod += carry;
		carry = wordLess01(prod, carry);
		b[i] += prod;
		carry |= wordLess01(b[i], prod);
	}
	prod = w = carry = 0;
}